

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O2

bool chapter2::calc_elems(vector<int,_std::allocator<int>_> *ivec,int pos)

{
  ostream *poVar1;
  
  if ((uint)pos < 0x41) {
    if ((ulong)((long)(ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(ivec->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 2) < (ulong)(uint)pos) {
      really_calc_elems(ivec,pos);
    }
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,"Sorry, invalid position.");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,pos);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  return (uint)pos < 0x41;
}

Assistant:

bool calc_elems(vector<int> &ivec, int pos) {
        if (pos < 0 || pos > 64) {
            cerr << "Sorry, invalid position." << pos << endl;
            return false;
        }

        if (ivec.size() < pos) {
            really_calc_elems(ivec, pos);
        }
        return true;
    }